

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O1

void ngx_unescape_uri(u_char **dst,u_char **src,size_t size,ngx_uint_t type)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  int iVar7;
  char cVar8;
  
  pbVar6 = *dst;
  pbVar5 = *src;
  if (size != 0) {
    iVar7 = 0;
    pbVar1 = pbVar5;
    bVar4 = 0;
    do {
      pbVar5 = pbVar1 + 1;
      bVar2 = *pbVar1;
      bVar3 = bVar4;
      if (iVar7 == 2) {
        if ((byte)(bVar2 - 0x30) < 10) {
          cVar8 = bVar2 + bVar4 * '\x10';
          if (((type & 2) == 0) || ((byte)(cVar8 + 0xaaU) < 0x59)) {
            *pbVar6 = cVar8 - 0x30;
LAB_001180bf:
            pbVar6 = pbVar6 + 1;
          }
          else {
            *pbVar6 = 0x25;
            pbVar6[1] = pbVar1[-1];
            pbVar6[2] = *pbVar1;
            pbVar6 = pbVar6 + 3;
          }
          iVar7 = 0;
          bVar3 = bVar4;
        }
        else {
          iVar7 = 0;
          if ((byte)((bVar2 | 0x20) + 0x9f) < 6) {
            cVar8 = (bVar2 | 0x20) + bVar4 * '\x10';
            bVar4 = cVar8 + 0xa9;
            if ((type & 1) == 0) {
              if ((type & 2) != 0) {
                if (bVar4 == 0x3f) goto LAB_0011816b;
                if (0x58 < (byte)(cVar8 + 0x83U)) {
                  *pbVar6 = 0x25;
                  pbVar6[1] = pbVar1[-1];
                  pbVar6[2] = *pbVar1;
                  pbVar6 = pbVar6 + 3;
                  iVar7 = 0;
                  goto LAB_001180c8;
                }
              }
              *pbVar6 = bVar4;
              pbVar6 = pbVar6 + 1;
            }
            else {
              pbVar1 = pbVar6 + 1;
              *pbVar6 = bVar4;
              pbVar6 = pbVar1;
              if (bVar4 == 0x3f) break;
            }
          }
        }
      }
      else if (iVar7 == 1) {
        bVar3 = bVar2 - 0x30;
        iVar7 = 2;
        if (9 < bVar3) {
          if (5 < (byte)((bVar2 | 0x20) + 0x9f)) {
LAB_001180bc:
            *pbVar6 = bVar2;
            goto LAB_001180bf;
          }
          bVar3 = (bVar2 | 0x20) + 0xa9;
        }
      }
      else {
        if (((type & 3) != 0) && (bVar2 == 0x3f)) {
          bVar4 = 0x3f;
LAB_0011816b:
          *pbVar6 = bVar4;
          pbVar6 = pbVar6 + 1;
          break;
        }
        iVar7 = 1;
        if (bVar2 != 0x25) goto LAB_001180bc;
      }
LAB_001180c8:
      size = size - 1;
      pbVar1 = pbVar5;
      bVar4 = bVar3;
    } while (size != 0);
  }
  *dst = pbVar6;
  *src = pbVar5;
  return;
}

Assistant:

void
ngx_unescape_uri(u_char **dst, u_char **src, size_t size, ngx_uint_t type)
{
    u_char  *d, *s, ch, c, decoded;
    enum {
        sw_usual = 0,
        sw_quoted,
        sw_quoted_second
    } state;

    d = *dst;
    s = *src;

    state = 0;
    decoded = 0;

    while (size--) {

        ch = *s++;

        switch (state) {
        case sw_usual:
            if (ch == '?'
                && (type & (NGX_UNESCAPE_URI|NGX_UNESCAPE_REDIRECT)))
            {
                *d++ = ch;
                goto done;
            }

            if (ch == '%') {
                state = sw_quoted;
                break;
            }

            *d++ = ch;
            break;

        case sw_quoted:

            if (ch >= '0' && ch <= '9') {
                decoded = (u_char) (ch - '0');
                state = sw_quoted_second;
                break;
            }

            c = (u_char) (ch | 0x20);
            if (c >= 'a' && c <= 'f') {
                decoded = (u_char) (c - 'a' + 10);
                state = sw_quoted_second;
                break;
            }

            /* the invalid quoted character */

            state = sw_usual;

            *d++ = ch;

            break;

        case sw_quoted_second:

            state = sw_usual;

            if (ch >= '0' && ch <= '9') {
                ch = (u_char) ((decoded << 4) + ch - '0');

                if (type & NGX_UNESCAPE_REDIRECT) {
                    if (ch > '%' && ch < 0x7f) {
                        *d++ = ch;
                        break;
                    }

                    *d++ = '%'; *d++ = *(s - 2); *d++ = *(s - 1);

                    break;
                }

                *d++ = ch;

                break;
            }

            c = (u_char) (ch | 0x20);
            if (c >= 'a' && c <= 'f') {
                ch = (u_char) ((decoded << 4) + c - 'a' + 10);

                if (type & NGX_UNESCAPE_URI) {
                    if (ch == '?') {
                        *d++ = ch;
                        goto done;
                    }

                    *d++ = ch;
                    break;
                }

                if (type & NGX_UNESCAPE_REDIRECT) {
                    if (ch == '?') {
                        *d++ = ch;
                        goto done;
                    }

                    if (ch > '%' && ch < 0x7f) {
                        *d++ = ch;
                        break;
                    }

                    *d++ = '%'; *d++ = *(s - 2); *d++ = *(s - 1);
                    break;
                }

                *d++ = ch;

                break;
            }

            /* the invalid quoted character */

            break;
        }
    }

done:

    *dst = d;
    *src = s;
}